

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
adios2::query::QueryVar::BlockIndexEvaluate
          (QueryVar *this,IO *io,Engine *reader,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *touchedBlocks)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  DataType DVar7;
  Variable<double> *var_12;
  Variable<long_double> *var_13;
  size_type sVar8;
  Box<Dims> *in_RCX;
  Engine *in_RDX;
  IO *in_RSI;
  BlockHit blk;
  iterator __end3;
  iterator __begin3;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *__range3;
  BlockIndex<long_double> idx_11;
  Variable<long_double> *var_11;
  BlockIndex<double> idx_10;
  Variable<double> *var_10;
  BlockIndex<float> idx_9;
  Variable<float> *var_9;
  BlockIndex<unsigned_long> idx_8;
  Variable<unsigned_long> *var_8;
  BlockIndex<unsigned_int> idx_7;
  Variable<unsigned_int> *var_7;
  BlockIndex<unsigned_short> idx_6;
  Variable<unsigned_short> *var_6;
  BlockIndex<unsigned_char> idx_5;
  Variable<unsigned_char> *var_5;
  BlockIndex<long> idx_4;
  Variable<long> *var_4;
  BlockIndex<int> idx_3;
  Variable<int> *var_3;
  BlockIndex<short> idx_2;
  Variable<short> *var_2;
  BlockIndex<signed_char> idx_1;
  Variable<signed_char> *var_1;
  BlockIndex<char> idx;
  Variable<char> *var;
  DataType varType;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>
  *in_stack_fffffffffffffdc8;
  __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
  *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
  local_1e0 [2];
  string *in_stack_fffffffffffffe30;
  IO *in_stack_fffffffffffffe38;
  BlockIndex<long_double> *in_stack_fffffffffffffe40;
  __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
  local_1b8;
  Box<Dims> *referenceRegion;
  Variable<long_double> *in_stack_fffffffffffffe58;
  IO *in_stack_fffffffffffffe60;
  Variable<double> *in_stack_fffffffffffffe78;
  IO *in_stack_fffffffffffffe80;
  BlockIndex<float> local_168;
  Variable<float> *local_150;
  BlockIndex<unsigned_long> local_148;
  Variable<unsigned_long> *local_130;
  BlockIndex<unsigned_int> local_128;
  Variable<unsigned_int> *local_110;
  BlockIndex<unsigned_short> local_108;
  Variable<unsigned_short> *local_f0;
  BlockIndex<unsigned_char> local_e8;
  Variable<unsigned_char> *local_d0;
  BlockIndex<long> local_c8;
  Variable<long> *local_b0;
  BlockIndex<int> local_a8;
  Variable<int> *local_90;
  BlockIndex<short> local_88;
  Variable<short> *local_70;
  BlockIndex<signed_char> local_68;
  Variable<signed_char> *local_50;
  BlockIndex<char> local_48;
  Variable<char> *local_30;
  DataType local_24;
  Box<Dims> *local_20;
  Engine *local_18;
  IO *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  DVar2 = core::IO::InquireVariableType
                    ((IO *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_24 = DVar2;
  DVar3 = helper::GetDataType<char>();
  if (DVar2 == DVar3) {
    local_30 = core::IO::InquireVariable<char>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<char>::BlockIndex(&local_48,local_30,local_10,local_18);
    BlockIndex<char>::Evaluate
              ((BlockIndex<char> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar2 = local_24;
  DVar3 = helper::GetDataType<signed_char>();
  if (DVar2 == DVar3) {
    local_50 = core::IO::InquireVariable<signed_char>
                         (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<signed_char>::BlockIndex(&local_68,local_50,local_10,local_18);
    BlockIndex<signed_char>::Evaluate
              ((BlockIndex<signed_char> *)in_stack_fffffffffffffe40,
               (QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar2 = local_24;
  DVar3 = helper::GetDataType<short>();
  if (DVar2 == DVar3) {
    local_70 = core::IO::InquireVariable<short>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30)
    ;
    BlockIndex<short>::BlockIndex(&local_88,local_70,local_10,local_18);
    BlockIndex<short>::Evaluate
              ((BlockIndex<short> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar2 = local_24;
  DVar3 = helper::GetDataType<int>();
  if (DVar2 == DVar3) {
    local_90 = core::IO::InquireVariable<int>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<int>::BlockIndex(&local_a8,local_90,local_10,local_18);
    BlockIndex<int>::Evaluate
              ((BlockIndex<int> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar2 = local_24;
  DVar3 = helper::GetDataType<long>();
  if (DVar2 == DVar3) {
    local_b0 = core::IO::InquireVariable<long>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<long>::BlockIndex(&local_c8,local_b0,local_10,local_18);
    BlockIndex<long>::Evaluate
              ((BlockIndex<long> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar2 = local_24;
  DVar3 = helper::GetDataType<unsigned_char>();
  if (DVar2 == DVar3) {
    local_d0 = core::IO::InquireVariable<unsigned_char>
                         (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<unsigned_char>::BlockIndex(&local_e8,local_d0,local_10,local_18);
    BlockIndex<unsigned_char>::Evaluate
              ((BlockIndex<unsigned_char> *)in_stack_fffffffffffffe40,
               (QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar3 = local_24;
  DVar4 = helper::GetDataType<unsigned_short>();
  if (DVar3 == DVar4) {
    local_f0 = core::IO::InquireVariable<unsigned_short>
                         (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<unsigned_short>::BlockIndex(&local_108,local_f0,local_10,local_18);
    BlockIndex<unsigned_short>::Evaluate
              ((BlockIndex<unsigned_short> *)in_stack_fffffffffffffe40,
               (QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar4 = local_24;
  DVar5 = helper::GetDataType<unsigned_int>();
  if (DVar4 == DVar5) {
    local_110 = core::IO::InquireVariable<unsigned_int>
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<unsigned_int>::BlockIndex(&local_128,local_110,local_10,local_18);
    BlockIndex<unsigned_int>::Evaluate
              ((BlockIndex<unsigned_int> *)in_stack_fffffffffffffe40,
               (QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar5 = local_24;
  DVar6 = helper::GetDataType<unsigned_long>();
  if (DVar5 == DVar6) {
    local_130 = core::IO::InquireVariable<unsigned_long>
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<unsigned_long>::BlockIndex(&local_148,local_130,local_10,local_18);
    BlockIndex<unsigned_long>::Evaluate
              ((BlockIndex<unsigned_long> *)in_stack_fffffffffffffe40,
               (QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar6 = local_24;
  DVar7 = helper::GetDataType<float>();
  if (DVar6 == DVar7) {
    local_150 = core::IO::InquireVariable<float>
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<float>::BlockIndex(&local_168,local_150,local_10,local_18);
    BlockIndex<float>::Evaluate
              ((BlockIndex<float> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  DVar6 = local_24;
  DVar7 = helper::GetDataType<double>();
  if (DVar6 == DVar7) {
    var_12 = core::IO::InquireVariable<double>(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<double>::BlockIndex
              ((BlockIndex<double> *)&stack0xfffffffffffffe78,var_12,local_10,local_18);
    BlockIndex<double>::Evaluate
              ((BlockIndex<double> *)in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38
               ,(vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                in_stack_fffffffffffffe30);
  }
  DVar6 = local_24;
  DVar7 = helper::GetDataType<long_double>();
  if (DVar6 == DVar7) {
    var_13 = core::IO::InquireVariable<long_double>
                       (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    BlockIndex<long_double>::BlockIndex
              ((BlockIndex<long_double> *)&stack0xfffffffffffffe58,var_13,local_10,local_18);
    BlockIndex<long_double>::Evaluate
              (in_stack_fffffffffffffe40,(QueryVar *)in_stack_fffffffffffffe38,
               (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               in_stack_fffffffffffffe30);
  }
  sVar8 = std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::size
                    ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                     local_20);
  if (sVar8 != 0) {
    LimitToSelection((QueryVar *)in_stack_fffffffffffffe80,
                     (vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                     in_stack_fffffffffffffe78);
    local_1b8._M_current =
         (BlockHit *)
         std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::begin
                   (in_stack_fffffffffffffdc8);
    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::end
              (in_stack_fffffffffffffdc8);
    referenceRegion = local_20;
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffdd0,
                              (__normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
                               *)in_stack_fffffffffffffdc8), bVar1) {
      __gnu_cxx::
      __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
      ::operator*(&local_1b8);
      in_stack_fffffffffffffdd0 = local_1e0;
      BlockHit::BlockHit((BlockHit *)CONCAT44(DVar2,DVar3),(BlockHit *)CONCAT44(DVar4,DVar5));
      bVar1 = BlockHit::isLocalArrayBlock((BlockHit *)0xd29acb);
      if (!bVar1) {
        QueryBase::ApplyOutputRegion
                  ((QueryBase *)in_stack_fffffffffffffe60,
                   (vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_fffffffffffffe58,referenceRegion);
      }
      BlockHit::~BlockHit((BlockHit *)0xd29b19);
      __gnu_cxx::
      __normal_iterator<adios2::query::BlockHit_*,_std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>_>
      ::operator++(&local_1b8);
    }
  }
  return;
}

Assistant:

void QueryVar::BlockIndexEvaluate(adios2::core::IO &io, adios2::core::Engine &reader,
                                  std::vector<BlockHit> &touchedBlocks)
{
    const DataType varType = io.InquireVariableType(m_VarName);

    // var already exists when loading query. skipping validity checking
#define declare_type(T)                                                                            \
    if (varType == adios2::helper::GetDataType<T>())                                               \
    {                                                                                              \
        core::Variable<T> *var = io.InquireVariable<T>(m_VarName);                                 \
        BlockIndex<T> idx(var, io, reader);                                                        \
        idx.Evaluate(*this, touchedBlocks);                                                        \
    }
    // ADIOS2_FOREACH_ATTRIBUTE_TYPE_1ARG(declare_type) //skip complex types
    ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type

    if (touchedBlocks.size() > 0)
    {
        LimitToSelection(touchedBlocks);

        for (auto blk : touchedBlocks)
        {
            if (!blk.isLocalArrayBlock())
            {
                ApplyOutputRegion(blk.m_Regions, m_Selection);
            }
        }
    }
}